

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.h
# Opt level: O0

size_t __thiscall booster::locale::date_time_period_set::size(date_time_period_set *this)

{
  bool bVar1;
  period_type *this_00;
  size_type sVar2;
  long in_RDI;
  period_type *in_stack_ffffffffffffffb8;
  period_type *in_stack_ffffffffffffffc0;
  period_type local_20;
  period_type local_1c;
  period_type local_18;
  period_type local_14 [3];
  size_t local_8;
  
  period::period_type::period_type(local_14,invalid);
  bVar1 = period::period_type::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    period::period_type::period_type(&local_18,invalid);
    bVar1 = period::period_type::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (bVar1) {
      local_8 = 1;
    }
    else {
      period::period_type::period_type(&local_1c,invalid);
      bVar1 = period::period_type::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (bVar1) {
        local_8 = 2;
      }
      else {
        this_00 = (period_type *)(in_RDI + 0x18);
        period::period_type::period_type(&local_20,invalid);
        bVar1 = period::period_type::operator==(this_00,in_stack_ffffffffffffffb8);
        if (bVar1) {
          local_8 = 3;
        }
        else {
          sVar2 = std::
                  vector<booster::locale::date_time_period,_std::allocator<booster::locale::date_time_period>_>
                  ::size((vector<booster::locale::date_time_period,_std::allocator<booster::locale::date_time_period>_>
                          *)(in_RDI + 0x20));
          local_8 = sVar2 + 4;
        }
      }
    }
  }
  return local_8;
}

Assistant:

size_t size() const
            {
                if(basic_[0].type == period::period_type())
                    return 0;
                if(basic_[1].type == period::period_type())
                    return 1;
                if(basic_[2].type == period::period_type())
                    return 2;
                if(basic_[3].type == period::period_type())
                    return 3;
                return 4+periods_.size();
            }